

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screenshot.cpp
# Opt level: O3

bool polyscope::anon_unknown_5::hasExtension(string *str,string *ext)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  string *psVar4;
  string *psVar5;
  size_type sVar6;
  
  sVar1 = str->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (str->_M_dataplus)._M_p;
    sVar6 = 0;
    do {
      iVar3 = tolower((int)pcVar2[sVar6]);
      pcVar2[sVar6] = (char)iVar3;
      sVar6 = sVar6 + 1;
    } while (sVar1 != sVar6);
  }
  sVar1 = ext->_M_string_length;
  if (sVar1 == 0) {
    psVar5 = (string *)str->_M_string_length;
    psVar4 = (string *)0x0;
  }
  else {
    pcVar2 = (ext->_M_dataplus)._M_p;
    sVar6 = 0;
    do {
      iVar3 = tolower((int)pcVar2[sVar6]);
      pcVar2[sVar6] = (char)iVar3;
      sVar6 = sVar6 + 1;
    } while (sVar1 != sVar6);
    psVar4 = (string *)ext->_M_string_length;
    psVar5 = (string *)str->_M_string_length;
    if (psVar5 < psVar4) {
      return false;
    }
  }
  iVar3 = std::__cxx11::string::compare((ulong)str,(long)psVar5 - (long)psVar4,psVar4);
  return iVar3 == 0;
}

Assistant:

bool hasExtension(std::string str, std::string ext) {

  std::transform(str.begin(), str.end(), str.begin(), ::tolower);
  std::transform(ext.begin(), ext.end(), ext.begin(), ::tolower);

  if (str.length() >= ext.length()) {
    return (0 == str.compare(str.length() - ext.length(), ext.length(), ext));
  } else {
    return false;
  }
}